

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O0

int __thiscall CVmObjFile::read_file(CVmObjFile *this,char *buf,int32_t *len)

{
  CVmDataSource *pCVar1;
  vmobjfile_readbuf_t *this_00;
  uint uVar2;
  int iVar3;
  int iVar4;
  vmobjfile_ext_t *pvVar5;
  vmobjfile_readbuf_t *this_01;
  size_t sVar6;
  int *in_RDX;
  long in_RSI;
  CVmObjFile *in_RDI;
  size_t csiz;
  size_t b;
  wchar_t ch;
  int32_t actual;
  CCharmapToUni *charmap;
  vmobjfile_readbuf_t *readbuf;
  CVmDataSource *fp;
  undefined4 in_stack_ffffffffffffffa0;
  CCharmapToUni *in_stack_ffffffffffffffb0;
  CVmDataSource *in_stack_ffffffffffffffb8;
  wchar_t in_stack_ffffffffffffffc0;
  int local_4;
  
  pvVar5 = get_ext(in_RDI);
  pCVar1 = pvVar5->fp;
  pvVar5 = get_ext(in_RDI);
  if (((pvVar5->flags & 1) == 0) && (pCVar1 != (CVmDataSource *)0x0)) {
    switch_read_write_mode((CVmObjFile *)in_stack_ffffffffffffffb0,(int)((ulong)in_RDI >> 0x20));
    pvVar5 = get_ext(in_RDI);
    uVar2 = (uint)pvVar5->mode;
    if (uVar2 == 1) {
      pvVar5 = get_ext(in_RDI);
      this_00 = pvVar5->readbuf;
      get_ext(in_RDI);
      vm_objp(0);
      this_01 = (vmobjfile_readbuf_t *)
                CVmObjCharSet::get_to_uni
                          ((CVmObjCharSet *)CONCAT44(uVar2,in_stack_ffffffffffffffa0));
      iVar4 = 0;
      while ((iVar3 = vmobjfile_readbuf_t::peekch
                                (this_01,(wchar_t *)CONCAT44(iVar4,in_stack_ffffffffffffffc0),
                                 in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                                 (size_t *)in_RDI), iVar3 != 0 &&
             (in_stack_ffffffffffffffb0 =
                   (CCharmapToUni *)utf8_ptr::s_wchar_size(in_stack_ffffffffffffffc0),
             iVar4 + (int)in_stack_ffffffffffffffb0 <= *in_RDX))) {
        sVar6 = utf8_ptr::s_putch((char *)(in_RSI + iVar4),in_stack_ffffffffffffffc0);
        iVar4 = iVar4 + (int)sVar6;
        vmobjfile_readbuf_t::commit_peek(this_00,(size_t)in_stack_ffffffffffffffb8);
      }
      *in_RDX = iVar4;
    }
    else {
      if (uVar2 != 3) {
        return 0;
      }
      iVar4 = (*pCVar1->_vptr_CVmDataSource[3])(pCVar1,in_RSI,(long)*in_RDX);
      *in_RDX = iVar4;
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVmObjFile::read_file(VMG_ char *buf, int32_t &len)
{
    /* get the data source */
    CVmDataSource *fp = get_ext()->fp;

    /* make sure it's valid */
    if ((get_ext()->flags & VMOBJFILE_OUT_OF_SYNC) != 0 || fp == 0)
        return FALSE;

    /* deal with stdio buffering if we're changing modes */
    switch_read_write_mode(vmg_ FALSE);

    /* read according to the mode */
    switch (get_ext()->mode)
    {
    case VMOBJFILE_MODE_TEXT:
        {
            /* get the read buffer and character mapper */
            vmobjfile_readbuf_t *readbuf = get_ext()->readbuf;
            CCharmapToUni *charmap =
                ((CVmObjCharSet *)vm_objp(vmg_ get_ext()->charset))
                ->get_to_uni(vmg0_);

            /* loop until we satisfy the request */
            int32_t actual;
            for (actual = 0 ; ; )
            {
                /* peek at the next character */
                wchar_t ch;
                size_t b;
                if (!readbuf->peekch(ch, fp, charmap, b))
                    break;

                /* make sure it'll fit */
                size_t csiz = utf8_ptr::s_wchar_size(ch);
                if (actual + (int32_t)csiz > len)
                    break;

                /* store this character */
                actual += utf8_ptr::s_putch(buf + actual, ch);

                /* advance to the next character */
                readbuf->commit_peek(b);
            }

            /* set the actual return length */
            len = actual;
        }
        break;

    case VMOBJFILE_MODE_RAW:
        /* do the direct read */
        len = fp->readc(buf, (size_t)len);
        break;

    default:
        /* can't handle others */
        return FALSE;
    }

    /* success */
    return TRUE;
}